

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_transfers.c
# Opt level: O2

void CGTFS_RecordTransfer(void)

{
  int iVar1;
  int iVar2;
  transfer_t a;
  char *field_values [4];
  char *field_names [4];
  
  iVar1 = greatest_test_pre("transfer_read");
  if (iVar1 != 0) {
    iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (iVar1 == 0) {
      iVar1 = -1;
      field_names[2] = "transfer_type";
      field_names[3] = "min_transfer_time";
      field_names[0] = "from_stop_id";
      field_names[1] = "to_stop_id";
      field_values[2] = "2";
      field_values[3] = "120";
      field_values[0] = "S180";
      field_values[1] = "R360";
      read_transfer(&a,4,field_names,field_values);
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar2 = greatest_do_assert_equal_t("S180",&a,&greatest_type_info_string,(void *)0x0);
      if (iVar2 == 0) {
        greatest_info.fail_line = 0x14;
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
LAB_00122c25:
          greatest_info.msg = "type_info->equal callback missing!";
        }
        else {
          greatest_info.msg = "\"S180\" != t_1.from_stop_id";
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar2 = greatest_do_assert_equal_t
                          ("R360",a.to_stop_id,&greatest_type_info_string,(void *)0x0);
        if (iVar2 == 0) {
          greatest_info.fail_line = 0x15;
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) goto LAB_00122c25;
          greatest_info.msg = "\"R360\" != t_1.to_stop_id";
        }
        else if (a.transfer_type == TT_TIME_REQUIRED) {
          greatest_info.assertions = greatest_info.assertions + 2;
          if (a.min_transfer_time == 0x78) {
            greatest_info.msg = (char *)0x0;
            iVar1 = 0;
            goto LAB_00122c84;
          }
          greatest_info.fail_line = 0x17;
          greatest_info.msg = "120 != t_1.min_transfer_time";
        }
        else {
          greatest_info.fail_line = 0x16;
          greatest_info.msg = "TT_TIME_REQUIRED != t_1.transfer_type";
          greatest_info.assertions = greatest_info.assertions + 1;
        }
      }
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_transfers.c"
      ;
      if ((greatest_info.flags & 4) != 0) goto LAB_00122de8;
    }
LAB_00122c84:
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("transfer_compare");
  if (iVar1 == 0) {
    return;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
  if (iVar1 == 0) {
    memcpy(&a,"0STP8",0x88);
    memcpy((transfer_t *)field_names,"0STP8",0x88);
    memcpy(field_values,"0STP8",0x88);
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = equal_transfer(&a,(transfer_t *)field_names);
    if (iVar1 == 1) {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = equal_transfer(&a,(transfer_t *)field_values);
      if (iVar1 == 0) {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = equal_transfer((transfer_t *)field_names,(transfer_t *)field_values);
        if (iVar1 == 0) {
          greatest_info.msg = (char *)0x0;
          iVar1 = 0;
          goto LAB_00122d87;
        }
        greatest_info.fail_line = 0x34;
        greatest_info.msg = "0 != equal_transfer(&b, &c)";
      }
      else {
        greatest_info.fail_line = 0x33;
        greatest_info.msg = "0 != equal_transfer(&a, &c)";
      }
    }
    else {
      greatest_info.fail_line = 0x32;
      greatest_info.msg = "1 != equal_transfer(&a, &b)";
    }
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_transfers.c"
    ;
    if ((greatest_info.flags & 4) != 0) {
LAB_00122de8:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_transfers.c"
      ;
      abort();
    }
    iVar1 = -1;
  }
LAB_00122d87:
  greatest_test_post(iVar1);
  return;
}

Assistant:

SUITE(CGTFS_RecordTransfer) {
    RUN_TEST(transfer_read);
    RUN_TEST(transfer_compare);
}